

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_paged_audio_buffer_data_init
                    (ma_format format,ma_uint32 channels,ma_paged_audio_buffer_data *pData)

{
  undefined4 *in_RDX;
  undefined4 in_ESI;
  undefined4 in_EDI;
  ma_result local_14;
  
  if (in_RDX == (undefined4 *)0x0) {
    local_14 = MA_INVALID_ARGS;
  }
  else {
    if (in_RDX != (undefined4 *)0x0) {
      memset(in_RDX,0,0x28);
    }
    *in_RDX = in_EDI;
    in_RDX[1] = in_ESI;
    *(undefined4 **)(in_RDX + 8) = in_RDX + 2;
    local_14 = MA_SUCCESS;
  }
  return local_14;
}

Assistant:

MA_API ma_result ma_paged_audio_buffer_data_init(ma_format format, ma_uint32 channels, ma_paged_audio_buffer_data* pData)
{
    if (pData == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pData);

    pData->format   = format;
    pData->channels = channels;
    pData->pTail    = &pData->head;

    return MA_SUCCESS;
}